

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::MultisampleTests::init(MultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  NumSamplesCase *pNVar1;
  CommonEdgeCase *pCVar2;
  MultisampleCase *pMVar3;
  
  pNVar1 = (NumSamplesCase *)operator_new(200);
  NumSamplesCase::NumSamplesCase
            (pNVar1,(this->super_TestCaseGroup).m_context,"num_samples_polygon",
             "Test sanity of the value of GL_SAMPLES, with polygons");
  (pNVar1->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NumSamplesCase_0212dbc8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pNVar1 = (NumSamplesCase *)operator_new(200);
  NumSamplesCase::NumSamplesCase
            (pNVar1,(this->super_TestCaseGroup).m_context,"num_samples_line",
             "Test sanity of the value of GL_SAMPLES, with lines");
  (pNVar1->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NumSamplesCase_0212dc10;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pCVar2 = (CommonEdgeCase *)operator_new(0xb8);
  CommonEdgeCase::CommonEdgeCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_small_quads",
             "Test polygons\' common edges with small quads",CASETYPE_SMALL_QUADS);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar2);
  pCVar2 = (CommonEdgeCase *)operator_new(0xb8);
  CommonEdgeCase::CommonEdgeCase
            (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_big_quad",
             "Test polygons\' common edges with bigger-than-viewport quads",
             CASETYPE_BIGGER_THAN_VIEWPORT_QUAD);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar2);
  pMVar3 = (MultisampleCase *)operator_new(0xb8);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"common_edge_viewport_quad",
             "Test polygons\' common edges with exactly viewport-sized quads");
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dc58;
  pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x800000002;
  *(undefined4 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pNVar1 = (NumSamplesCase *)operator_new(200);
  NumSamplesCase::NumSamplesCase
            (pNVar1,(this->super_TestCaseGroup).m_context,"depth",
             "Test that depth values are per-sample");
  (pNVar1->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NumSamplesCase_0212dc98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pNVar1);
  pMVar3 = (MultisampleCase *)operator_new(0xa8);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"stencil",
             "Test that stencil values are per-sample");
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dce0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xa8);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"sample_coverage_invert",
             "Test that non-inverted and inverted sample coverage masks are each other\'s negations"
            );
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dda0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb8);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_alpha_to_coverage",
             "Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE");
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd20;
  *(undefined4 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  pMVar3[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0xffffffff00000000;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb8);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_sample_coverage",
             "Test the proportionality property of GL_SAMPLE_COVERAGE");
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd20;
  *(undefined4 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  pMVar3[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0xffffffff00000000;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb8);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_sample_coverage_inverted"
             ,"Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE");
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd20;
  *(undefined4 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 2;
  pMVar3[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0xffffffff00000000;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb0);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"constancy_alpha_to_coverage",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE"
            );
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd60;
  *(undefined2 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  *(undefined1 *)((long)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2)
       = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb0);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE"
            );
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd60;
  *(undefined2 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2)
       = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb0);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage_inverted",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE"
            );
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd60;
  *(undefined2 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2)
       = 1;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb0);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"constancy_both",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE"
            );
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd60;
  *(undefined2 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x101;
  *(undefined1 *)((long)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2)
       = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  pMVar3 = (MultisampleCase *)operator_new(0xb0);
  MultisampleCase::MultisampleCase
            (pMVar3,(this->super_TestCaseGroup).m_context,"constancy_both_inverted",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE"
            );
  (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_0212dd60;
  *(undefined2 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x101;
  *(undefined1 *)((long)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 2)
       = 1;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar3);
  return extraout_EAX;
}

Assistant:

void MultisampleTests::init (void)
{
	addChild(new PolygonNumSamplesCase		(m_context, "num_samples_polygon",			"Test sanity of the value of GL_SAMPLES, with polygons"));
	addChild(new LineNumSamplesCase			(m_context, "num_samples_line",				"Test sanity of the value of GL_SAMPLES, with lines"));
	addChild(new CommonEdgeCase				(m_context, "common_edge_small_quads",		"Test polygons' common edges with small quads",						CommonEdgeCase::CASETYPE_SMALL_QUADS));
	addChild(new CommonEdgeCase				(m_context, "common_edge_big_quad",			"Test polygons' common edges with bigger-than-viewport quads",		CommonEdgeCase::CASETYPE_BIGGER_THAN_VIEWPORT_QUAD));
	addChild(new CommonEdgeCase				(m_context, "common_edge_viewport_quad",	"Test polygons' common edges with exactly viewport-sized quads",	CommonEdgeCase::CASETYPE_FIT_VIEWPORT_QUAD));
	addChild(new SampleDepthCase			(m_context, "depth",						"Test that depth values are per-sample"));
	addChild(new SampleStencilCase			(m_context, "stencil",						"Test that stencil values are per-sample"));
	addChild(new CoverageMaskInvertCase		(m_context, "sample_coverage_invert",		"Test that non-inverted and inverted sample coverage masks are each other's negations"));

	addChild(new MaskProportionalityCase(m_context, "proportionality_alpha_to_coverage",			"Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",			MaskProportionalityCase::CASETYPE_ALPHA_TO_COVERAGE));
	addChild(new MaskProportionalityCase(m_context, "proportionality_sample_coverage",				"Test the proportionality property of GL_SAMPLE_COVERAGE",					MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE));
	addChild(new MaskProportionalityCase(m_context, "proportionality_sample_coverage_inverted",		"Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE_INVERTED));

	addChild(new MaskConstancyCase(m_context, "constancy_alpha_to_coverage",			"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE",											MaskConstancyCase::CASETYPE_ALPHA_TO_COVERAGE));
	addChild(new MaskConstancyCase(m_context, "constancy_sample_coverage",				"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE",													MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE));
	addChild(new MaskConstancyCase(m_context, "constancy_sample_coverage_inverted",		"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE",									MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE_INVERTED));
	addChild(new MaskConstancyCase(m_context, "constancy_both",							"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE",					MaskConstancyCase::CASETYPE_BOTH));
	addChild(new MaskConstancyCase(m_context, "constancy_both_inverted",				"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE",	MaskConstancyCase::CASETYPE_BOTH_INVERTED));
}